

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall
Potassco::AspifOutput::rule
          (AspifOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *body)

{
  startDir(this,(Directive_t)0x1);
  add(this,ht.val_);
  add(this,head);
  add(this,1);
  add(this,bound);
  add(this,body);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& body) {
	startDir(Directive_t::Rule).add(static_cast<int>(ht)).add(head)
		.add(static_cast<int>(Body_t::Sum)).add(static_cast<int>(bound)).add(body)
		.endDir();
}